

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arduino-rx-web.cpp
# Opt level: O3

bool GGWave_init(int playbackId,int captureId,int payloadLength,float sampleRateOffset,bool useDSS)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined8 uVar4;
  long lVar5;
  GGWave *pGVar6;
  uint uVar7;
  ulong uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  bool bVar11;
  float fVar12;
  SDL_AudioSpec playbackSpec;
  uint local_58;
  ushort uStack_54;
  byte bStack_52;
  undefined1 uStack_51;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  uint local_38;
  uint local_34;
  
  if ((anonymous_namespace)::g_devIdInp == 0 || (anonymous_namespace)::g_devIdOut == 0) {
    local_34 = payloadLength;
    if ((anonymous_namespace)::g_devIdInp == 0 && (anonymous_namespace)::g_devIdOut == 0) {
      SDL_LogSetPriority(0,3);
      iVar2 = SDL_Init(0x10);
      if (iVar2 < 0) {
        uVar4 = SDL_GetError();
        SDL_LogError(0,"Couldn\'t initialize SDL: %s\n",uVar4);
        return true;
      }
      SDL_SetHintWithPriority("SDL_AUDIO_RESAMPLING_MODE","medium",2);
      uVar3 = SDL_GetNumAudioDevices(0);
      printf("Found %d playback devices:\n",(ulong)uVar3);
      if (0 < (int)uVar3) {
        uVar8 = 0;
        do {
          uVar4 = SDL_GetAudioDeviceName(uVar8,0);
          printf("    - Playback device #%d: \'%s\'\n",uVar8,uVar4);
          uVar7 = (int)uVar8 + 1;
          uVar8 = (ulong)uVar7;
        } while (uVar3 != uVar7);
      }
      uVar3 = SDL_GetNumAudioDevices(1);
      printf("Found %d capture devices:\n",(ulong)uVar3);
      if (0 < (int)uVar3) {
        uVar8 = 0;
        do {
          uVar4 = SDL_GetAudioDeviceName(uVar8,1);
          printf("    - Capture device #%d: \'%s\'\n",uVar8,uVar4);
          uVar7 = (int)uVar8 + 1;
          uVar8 = (ulong)uVar7;
        } while (uVar3 != uVar7);
      }
    }
    if ((anonymous_namespace)::g_devIdOut == 0) {
      puts("Initializing playback ...");
      SDL_memset(&local_58,0,0x20);
      local_58 = (uint)(sampleRateOffset + 48000.0);
      uStack_54 = 0x8010;
      bStack_52 = 1;
      uStack_50._0_2_ = 0x4000;
      uStack_48 = 0;
      uStack_44 = 0;
      SDL_memset(&(anonymous_namespace)::g_obtainedSpecOut,0,0x20);
      if (playbackId < 0) {
        puts("Attempt to open default playback device ...");
        uVar4 = 0;
      }
      else {
        uVar4 = SDL_GetAudioDeviceName(playbackId,0);
        printf("Attempt to open playback device %d : \'%s\' ...\n",(ulong)(uint)playbackId,uVar4);
        uVar4 = SDL_GetAudioDeviceName(playbackId,0);
      }
      (anonymous_namespace)::g_devIdOut =
           SDL_OpenAudioDevice(uVar4,0,&local_58,&(anonymous_namespace)::g_obtainedSpecOut,0);
      bVar1 = (anonymous_namespace)::g_devIdOut != 0;
      if ((anonymous_namespace)::g_devIdOut == 0) {
        uVar4 = SDL_GetError();
        printf("Couldn\'t open an audio device for playback: %s!\n",uVar4);
        (anonymous_namespace)::g_devIdOut = 0;
      }
      else {
        printf("Obtained spec for output device (SDL Id = %d):\n",
               (ulong)(anonymous_namespace)::g_devIdOut);
        printf("    - Sample rate:       %d (required: %d)\n",
               (ulong)(anonymous_namespace)::g_obtainedSpecOut,(ulong)local_58);
        printf("    - Format:            %d (required: %d)\n",(ulong)DAT_00108304,(ulong)uStack_54);
        printf("    - Channels:          %d (required: %d)\n",(ulong)DAT_00108306,(ulong)bStack_52);
        printf("    - Samples per frame: %d (required: %d)\n",(ulong)DAT_00108308,
               (ulong)(ushort)uStack_50);
        if (((DAT_00108304 != uStack_54) || (DAT_00108306 != bStack_52)) ||
           (DAT_00108308 != (ushort)uStack_50)) {
          GGWave_init();
          goto LAB_00103845;
        }
      }
    }
    else {
      bVar1 = false;
    }
    if ((anonymous_namespace)::g_devIdInp == 0) {
      bStack_52 = DAT_00108306;
      uStack_51 = uRam0000000000108307;
      uStack_50._2_2_ = (undefined2)uRam000000000010830a;
      uStack_4c = (undefined4)((uint6)uRam000000000010830a >> 0x10);
      local_58 = (uint)(sampleRateOffset + 48000.0);
      uStack_48 = _DAT_00108310;
      uStack_44 = uRam0000000000108314;
      uStack_40 = uRam0000000000108318;
      uStack_3c = uRam000000000010831c;
      uStack_54 = 0x8120;
      uStack_50._0_2_ = 0x400;
      SDL_memset(&(anonymous_namespace)::g_obtainedSpecInp,0,0x20);
      if (captureId < 0) {
        puts("Attempt to open default capture device ...");
        lVar5 = _DAT_00108278;
        if (_DAT_00108278 != 0) {
          lVar5 = (anonymous_namespace)::g_defaultCaptureDeviceName_abi_cxx11_;
        }
      }
      else {
        uVar4 = SDL_GetAudioDeviceName(captureId,1);
        printf("Attempt to open capture device %d : \'%s\' ...\n",(ulong)(uint)captureId,uVar4);
        lVar5 = SDL_GetAudioDeviceName(captureId,1);
      }
      (anonymous_namespace)::g_devIdInp =
           SDL_OpenAudioDevice(lVar5,1,&local_58,&(anonymous_namespace)::g_obtainedSpecInp,0);
      if ((anonymous_namespace)::g_devIdInp == 0) {
        uVar4 = SDL_GetError();
        printf("Couldn\'t open an audio device for capture: %s!\n",uVar4);
        (anonymous_namespace)::g_devIdInp = 0;
      }
      else {
        printf("Obtained spec for input device (SDL Id = %d):\n",
               (ulong)(anonymous_namespace)::g_devIdInp);
        printf("    - Sample rate:       %d\n",(ulong)(anonymous_namespace)::g_obtainedSpecInp);
        printf("    - Format:            %d (required: %d)\n",(ulong)DAT_00108324,(ulong)uStack_54);
        printf("    - Channels:          %d (required: %d)\n",(ulong)DAT_00108326,(ulong)bStack_52);
        printf("    - Samples per frame: %d\n",(ulong)DAT_00108328);
        bVar1 = true;
      }
    }
    pGVar6 = (anonymous_namespace)::g_ggWave;
    uVar9 = 0;
    if (DAT_00108324 < 0x8010) {
      if (DAT_00108324 == 8) {
        uVar9 = 1;
      }
      else if (DAT_00108324 == 0x10) {
        uVar9 = 3;
      }
      else {
        uVar9 = 0;
        if (DAT_00108324 == 0x8008) {
          uVar9 = 2;
        }
      }
    }
    else if (DAT_00108324 == 0x8010) {
      uVar9 = 4;
    }
    else if ((DAT_00108324 == 0x8020) || (DAT_00108324 == 0x8120)) {
      uVar9 = 5;
    }
    uVar10 = 0;
    if (DAT_00108304 < 0x8010) {
      if (DAT_00108304 == 8) {
        uVar10 = 1;
      }
      else if (DAT_00108304 == 0x10) {
        uVar10 = 3;
      }
      else {
        uVar10 = 0;
        if (DAT_00108304 == 0x8008) {
          uVar10 = 2;
        }
      }
    }
    else if (DAT_00108304 == 0x8010) {
      uVar10 = 4;
    }
    else if ((DAT_00108304 == 0x8020) || (DAT_00108304 == 0x8120)) {
      uVar10 = 5;
    }
    bVar11 = true;
    if (bVar1) {
      if ((anonymous_namespace)::g_ggWave != (GGWave *)0x0) {
        GGWave::~GGWave((anonymous_namespace)::g_ggWave);
        operator_delete(pGVar6);
      }
      pGVar6 = (GGWave *)operator_new(0x5b8);
      local_58 = local_34;
      fVar12 = (float)(int)(anonymous_namespace)::g_obtainedSpecInp;
      uStack_50 = (float)(int)(anonymous_namespace)::g_obtainedSpecOut;
      uStack_54 = SUB42(fVar12,0);
      bStack_52 = (byte)((uint)fVar12 >> 0x10);
      uStack_51 = (undefined1)((uint)fVar12 >> 0x18);
      uStack_4c = 0x473b8000;
      uStack_48 = 0x200;
      uStack_44 = 0x40400000;
      uStack_40 = uVar9;
      uStack_3c = uVar10;
      local_38 = (uint)useDSS << 4 | 6;
      GGWave::GGWave(pGVar6,(ggwave_Parameters *)&local_58);
      (anonymous_namespace)::g_ggWave = pGVar6;
    }
  }
  else {
LAB_00103845:
    bVar11 = false;
  }
  return bVar11;
}

Assistant:

bool GGWave_init(
        const int playbackId,
        const int captureId,
        const int payloadLength,
        const float sampleRateOffset,
        const bool useDSS) {

    if (g_devIdInp && g_devIdOut) {
        return false;
    }

    if (g_devIdInp == 0 && g_devIdOut == 0) {
        SDL_LogSetPriority(SDL_LOG_CATEGORY_APPLICATION, SDL_LOG_PRIORITY_INFO);

        if (SDL_Init(SDL_INIT_AUDIO) < 0) {
            SDL_LogError(SDL_LOG_CATEGORY_APPLICATION, "Couldn't initialize SDL: %s\n", SDL_GetError());
            return (1);
        }

        SDL_SetHintWithPriority(SDL_HINT_AUDIO_RESAMPLING_MODE, "medium", SDL_HINT_OVERRIDE);

        {
            int nDevices = SDL_GetNumAudioDevices(SDL_FALSE);
            printf("Found %d playback devices:\n", nDevices);
            for (int i = 0; i < nDevices; i++) {
                printf("    - Playback device #%d: '%s'\n", i, SDL_GetAudioDeviceName(i, SDL_FALSE));
            }
        }
        {
            int nDevices = SDL_GetNumAudioDevices(SDL_TRUE);
            printf("Found %d capture devices:\n", nDevices);
            for (int i = 0; i < nDevices; i++) {
                printf("    - Capture device #%d: '%s'\n", i, SDL_GetAudioDeviceName(i, SDL_TRUE));
            }
        }
    }

    bool reinit = false;

    if (g_devIdOut == 0) {
        printf("Initializing playback ...\n");

        SDL_AudioSpec playbackSpec;
        SDL_zero(playbackSpec);

        playbackSpec.freq = GGWave::kDefaultSampleRate + sampleRateOffset;
        playbackSpec.format = AUDIO_S16SYS;
        playbackSpec.channels = 1;
        playbackSpec.samples = 16*1024;
        playbackSpec.callback = NULL;

        SDL_zero(g_obtainedSpecOut);

        if (playbackId >= 0) {
            printf("Attempt to open playback device %d : '%s' ...\n", playbackId, SDL_GetAudioDeviceName(playbackId, SDL_FALSE));
            g_devIdOut = SDL_OpenAudioDevice(SDL_GetAudioDeviceName(playbackId, SDL_FALSE), SDL_FALSE, &playbackSpec, &g_obtainedSpecOut, 0);
        } else {
            printf("Attempt to open default playback device ...\n");
            g_devIdOut = SDL_OpenAudioDevice(NULL, SDL_FALSE, &playbackSpec, &g_obtainedSpecOut, 0);
        }

        if (!g_devIdOut) {
            printf("Couldn't open an audio device for playback: %s!\n", SDL_GetError());
            g_devIdOut = 0;
        } else {
            printf("Obtained spec for output device (SDL Id = %d):\n", g_devIdOut);
            printf("    - Sample rate:       %d (required: %d)\n", g_obtainedSpecOut.freq, playbackSpec.freq);
            printf("    - Format:            %d (required: %d)\n", g_obtainedSpecOut.format, playbackSpec.format);
            printf("    - Channels:          %d (required: %d)\n", g_obtainedSpecOut.channels, playbackSpec.channels);
            printf("    - Samples per frame: %d (required: %d)\n", g_obtainedSpecOut.samples, playbackSpec.samples);

            if (g_obtainedSpecOut.format != playbackSpec.format ||
                g_obtainedSpecOut.channels != playbackSpec.channels ||
                g_obtainedSpecOut.samples != playbackSpec.samples) {
                g_devIdOut = 0;
                SDL_CloseAudio();
                fprintf(stderr, "Failed to initialize playback SDL_OpenAudio!");

                return false;
            }

            reinit = true;
        }
    }

    if (g_devIdInp == 0) {
        SDL_AudioSpec captureSpec;
        captureSpec = g_obtainedSpecOut;
        captureSpec.freq = GGWave::kDefaultSampleRate + sampleRateOffset;
        captureSpec.format = AUDIO_F32SYS;
        captureSpec.samples = 1024;

        SDL_zero(g_obtainedSpecInp);

        if (captureId >= 0) {
            printf("Attempt to open capture device %d : '%s' ...\n", captureId, SDL_GetAudioDeviceName(captureId, SDL_TRUE));
            g_devIdInp = SDL_OpenAudioDevice(SDL_GetAudioDeviceName(captureId, SDL_TRUE), SDL_TRUE, &captureSpec, &g_obtainedSpecInp, 0);
        } else {
            printf("Attempt to open default capture device ...\n");
            g_devIdInp = SDL_OpenAudioDevice(g_defaultCaptureDeviceName.empty() ? nullptr : g_defaultCaptureDeviceName.c_str(),
                                            SDL_TRUE, &captureSpec, &g_obtainedSpecInp, 0);
        }
        if (!g_devIdInp) {
            printf("Couldn't open an audio device for capture: %s!\n", SDL_GetError());
            g_devIdInp = 0;
        } else {
            printf("Obtained spec for input device (SDL Id = %d):\n", g_devIdInp);
            printf("    - Sample rate:       %d\n", g_obtainedSpecInp.freq);
            printf("    - Format:            %d (required: %d)\n", g_obtainedSpecInp.format, captureSpec.format);
            printf("    - Channels:          %d (required: %d)\n", g_obtainedSpecInp.channels, captureSpec.channels);
            printf("    - Samples per frame: %d\n", g_obtainedSpecInp.samples);

            reinit = true;
        }
    }

    GGWave::SampleFormat sampleFormatInp = GGWAVE_SAMPLE_FORMAT_UNDEFINED;
    GGWave::SampleFormat sampleFormatOut = GGWAVE_SAMPLE_FORMAT_UNDEFINED;

    switch (g_obtainedSpecInp.format) {
        case AUDIO_U8:      sampleFormatInp = GGWAVE_SAMPLE_FORMAT_U8;  break;
        case AUDIO_S8:      sampleFormatInp = GGWAVE_SAMPLE_FORMAT_I8;  break;
        case AUDIO_U16SYS:  sampleFormatInp = GGWAVE_SAMPLE_FORMAT_U16; break;
        case AUDIO_S16SYS:  sampleFormatInp = GGWAVE_SAMPLE_FORMAT_I16; break;
        case AUDIO_S32SYS:  sampleFormatInp = GGWAVE_SAMPLE_FORMAT_F32; break;
        case AUDIO_F32SYS:  sampleFormatInp = GGWAVE_SAMPLE_FORMAT_F32; break;
    }

    switch (g_obtainedSpecOut.format) {
        case AUDIO_U8:      sampleFormatOut = GGWAVE_SAMPLE_FORMAT_U8;  break;
        case AUDIO_S8:      sampleFormatOut = GGWAVE_SAMPLE_FORMAT_I8;  break;
        case AUDIO_U16SYS:  sampleFormatOut = GGWAVE_SAMPLE_FORMAT_U16; break;
        case AUDIO_S16SYS:  sampleFormatOut = GGWAVE_SAMPLE_FORMAT_I16; break;
        case AUDIO_S32SYS:  sampleFormatOut = GGWAVE_SAMPLE_FORMAT_F32; break;
        case AUDIO_F32SYS:  sampleFormatOut = GGWAVE_SAMPLE_FORMAT_F32; break;
            break;
    }

    if (reinit) {
        if (g_ggWave) delete g_ggWave;

        GGWave::OperatingMode mode = GGWAVE_OPERATING_MODE_RX_AND_TX;
        if (useDSS) mode |= GGWAVE_OPERATING_MODE_USE_DSS;

        g_ggWave = new GGWave({
            payloadLength,
            (float) g_obtainedSpecInp.freq,
            (float) g_obtainedSpecOut.freq,
            GGWave::kDefaultSampleRate,
            512,
            GGWave::kDefaultSoundMarkerThreshold,
            sampleFormatInp,
            sampleFormatOut,
            mode,
        });
    }

    return true;
}